

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# postscript.h
# Opt level: O2

void __thiscall
Gecko::PostScript::PostScript(PostScript *this,uint nodes,FILE *file,uint wx,uint wy)

{
  (this->super_Device)._vptr_Device = (_func_int **)&PTR__PostScript_0010aca0;
  this->file = file;
  this->page = 1;
  fprintf((FILE *)file,"%%!PS-Adobe-3.0 EPSF-2.0\n");
  fprintf((FILE *)file,"%%%%BoundingBox: 0 0 %u %u\n",(ulong)wx,(ulong)wy);
  fwrite("100 dict begin\n",0xf,1,(FILE *)file);
  fwrite("/Q { setrgbcolor rectfill } bind def\n",0x25,1,(FILE *)file);
  fprintf((FILE *)file,"%% circle: x y r\n");
  fwrite("/c { newpath 0 360 arc stroke } bind def\n",0x29,1,(FILE *)file);
  fprintf((FILE *)file,"%% disc: x y r\n");
  fwrite("/d { newpath 0 360 arc fill } bind def\n",0x27,1,(FILE *)file);
  fprintf((FILE *)file,"%% node: xpos radius grayfill n\n");
  fwrite("/n { 0.125 setlinewidth setgray 0 exch 3 copy d 0 setgray c } bind def\n",0x47,1,
         (FILE *)file);
  fwrite("/a { newpath setlinewidth exch 0 moveto 0 lineto stroke } bind def\n",0x43,1,(FILE *)file)
  ;
  fprintf((FILE *)file,"%% arc: x0 y0 x1 y1 x2 y2 r\n");
  fwrite("/A { newpath setlinewidth 7 -2 roll moveto arct stroke } bind def\n",0x42,1,(FILE *)file);
  this->origin = (double)wy * 0.5;
  this->scale = (double)wx / (double)nodes;
  return;
}

Assistant:

PostScript(uint nodes, FILE* file = stdout, uint wx = 576, uint wy = 576) : file(file), page(1)
  {
    fprintf(file, "%%!PS-Adobe-3.0 EPSF-2.0\n");
    fprintf(file, "%%%%BoundingBox: 0 0 %u %u\n", wx, wy);
    fprintf(file, "100 dict begin\n");
    fprintf(file, "/Q { setrgbcolor rectfill } bind def\n");
    fprintf(file, "%% circle: x y r\n");
    fprintf(file, "/c { newpath 0 360 arc stroke } bind def\n");
    fprintf(file, "%% disc: x y r\n");
    fprintf(file, "/d { newpath 0 360 arc fill } bind def\n");
    fprintf(file, "%% node: xpos radius grayfill n\n");
    fprintf(file, "/n { 0.125 setlinewidth setgray 0 exch 3 copy d 0 setgray c } bind def\n");
    fprintf(file, "/a { newpath setlinewidth exch 0 moveto 0 lineto stroke } bind def\n");
    fprintf(file, "%% arc: x0 y0 x1 y1 x2 y2 r\n");
    fprintf(file, "/A { newpath setlinewidth 7 -2 roll moveto arct stroke } bind def\n");
    origin = 0.5 * wy;
    scale = double(wx) / nodes;
  }